

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O0

void __thiscall
duckdb::ReduceExecuteInfo::ReduceExecuteInfo
          (ReduceExecuteInfo *this,LambdaInfo *info,ClientContext *context)

{
  bool bVar1;
  undefined8 uVar2;
  pointer this_00;
  Expression *args_1;
  ClientContext *args;
  size_type sVar3;
  value_type *__x;
  reference this_01;
  Vector *this_02;
  Expression *this_03;
  unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
  *in_RDX;
  long *in_RSI;
  long in_RDI;
  ValidityMask *this_04;
  idx_t new_size;
  idx_t i;
  idx_t in_stack_000000c0;
  SelectionVector *in_stack_000000c8;
  Vector *in_stack_000000d0;
  idx_t list_column_format_index;
  idx_t original_row_idx;
  idx_t reduced_row_idx;
  SelectionVector left_vector;
  string *in_stack_fffffffffffffea8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffeb0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffeb8;
  SelectionVector *in_stack_fffffffffffffec0;
  Vector *in_stack_fffffffffffffec8;
  LogicalTypeId id;
  ulong uVar4;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed0;
  undefined8 in_stack_ffffffffffffff00;
  idx_t in_stack_ffffffffffffff08;
  allocator *paVar5;
  undefined7 in_stack_ffffffffffffff10;
  ulong local_a0;
  allocator local_79;
  string local_78 [32];
  idx_t local_58;
  ulong local_50;
  long local_48;
  unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
  *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ValidityMask::ValidityMask((ValidityMask *)0x2058f4f);
  optional_ptr<duckdb::Vector,_true>::operator*
            ((optional_ptr<duckdb::Vector,_true> *)in_stack_fffffffffffffeb0);
  make_uniq<duckdb::Vector,duckdb::Vector&>(in_stack_fffffffffffffec8);
  this_04 = (ValidityMask *)(in_RDI + 0x28);
  unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>::
  unique_ptr((unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
              *)0x2058fab);
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x2058fc4);
  *(undefined8 *)(in_RDI + 0x48) = 1;
  SelectionVector::SelectionVector((SelectionVector *)0x2058fe5);
  new_size = in_RDI + 0x68;
  SelectionVector::SelectionVector((SelectionVector *)0x2058ffd);
  if ((*(byte *)((long)local_10 + 0x91) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0x48) = 0;
  }
  SelectionVector::SelectionVector
            ((SelectionVector *)in_stack_fffffffffffffed0,(idx_t)in_stack_fffffffffffffec8);
  ValidityMask::Resize(this_04,new_size);
  TemplatedValidityMask<unsigned_long>::SetAllValid
            (in_stack_fffffffffffffed0,(idx_t)in_stack_fffffffffffffec8);
  SelectionVector::Initialize(in_stack_fffffffffffffec0,(idx_t)in_stack_fffffffffffffeb8);
  SelectionVector::Initialize(in_stack_fffffffffffffec0,(idx_t)in_stack_fffffffffffffeb8);
  local_48 = 0;
  if ((*(byte *)((long)local_10 + 0x91) & 1) != 0) {
    SelectionVector::set_index
              (in_stack_fffffffffffffec0,(idx_t)in_stack_fffffffffffffeb8,
               (idx_t)in_stack_fffffffffffffeb0);
  }
  local_50 = 0;
  do {
    id = (LogicalTypeId)((ulong)in_stack_fffffffffffffec8 >> 0x38);
    if ((ulong)local_10[0x11] <= local_50) {
      unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                 in_stack_fffffffffffffeb0);
      Vector::Slice(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
      if ((*(byte *)(local_10 + 0x12) & 1) != 0) {
        LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffed0,id);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
        LogicalType::~LogicalType((LogicalType *)0x2059425);
      }
      this_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           in_stack_fffffffffffffeb0);
      Vector::GetType(this_00);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      args_1 = (Expression *)(in_RDI + 0x30);
      args = (ClientContext *)
             unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_stack_fffffffffffffeb0);
      Vector::GetType((Vector *)args);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      local_a0 = (ulong)(int)(uint)((*(byte *)((long)local_10 + 0x91) & 1) != 0);
      while (uVar4 = local_a0,
            sVar3 = ::std::
                    vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                    ::size((vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                            *)(local_10 + 0xd)), uVar4 < sVar3) {
        __x = (value_type *)(in_RDI + 0x30);
        this_01 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                            ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)
                             in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
        this_02 = ::std::reference_wrapper<duckdb::Vector>::get(&this_01->vector);
        Vector::GetType(this_02);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_01,__x)
        ;
        local_a0 = local_a0 + 1;
      }
      this_03 = optional_ptr<duckdb::Expression,_true>::operator*
                          ((optional_ptr<duckdb::Expression,_true> *)in_stack_fffffffffffffeb0);
      make_uniq<duckdb::ExpressionExecutor,duckdb::ClientContext&,duckdb::Expression&>(args,args_1);
      unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
      ::operator=((unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
                   *)this_03,local_18);
      unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
      ::~unique_ptr((unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
                     *)0x20595e6);
      SelectionVector::~SelectionVector((SelectionVector *)0x20595f3);
      return;
    }
    local_58 = SelectionVector::get_index((SelectionVector *)local_10[1],local_50);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0);
    if (bVar1) {
      if ((*(long *)(*local_10 + local_58 * 0x10 + 8) == 0) &&
         ((*(byte *)((long)local_10 + 0x91) & 1) == 0)) {
        uVar2 = __cxa_allocate_exception(0x10);
        paVar5 = &local_79;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_78,"Cannot perform list_reduce on an empty input list",paVar5);
        ParameterNotAllowedException::ParameterNotAllowedException
                  ((ParameterNotAllowedException *)in_stack_fffffffffffffeb0,
                   in_stack_fffffffffffffea8);
        __cxa_throw(uVar2,&ParameterNotAllowedException::typeinfo,
                    ParameterNotAllowedException::~ParameterNotAllowedException);
      }
      SelectionVector::set_index
                (in_stack_fffffffffffffec0,(idx_t)in_stack_fffffffffffffeb8,
                 (idx_t)in_stack_fffffffffffffeb0);
      local_48 = local_48 + 1;
    }
    else {
      FlatVector::SetNull((Vector *)CONCAT17(bVar1,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08,
                          SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_fffffffffffffeb0,(idx_t)in_stack_fffffffffffffea8);
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

ReduceExecuteInfo(LambdaFunctions::LambdaInfo &info, ClientContext &context)
	    : left_slice(make_uniq<Vector>(*info.child_vector)) {
		if (info.has_initial) {
			initial_value_offset = 0;
		}
		SelectionVector left_vector(info.row_count);
		active_rows.Resize(info.row_count);
		active_rows.SetAllValid(info.row_count);

		left_sel.Initialize(info.row_count);
		active_rows_sel.Initialize(info.row_count);

		idx_t reduced_row_idx = 0;

		if (info.has_initial) {
			left_vector.set_index(0, 0);
		}

		for (idx_t original_row_idx = 0; original_row_idx < info.row_count; original_row_idx++) {
			auto list_column_format_index = info.list_column_format.sel->get_index(original_row_idx);
			if (info.list_column_format.validity.RowIsValid(list_column_format_index)) {
				if (info.list_entries[list_column_format_index].length == 0 && !info.has_initial) {
					throw ParameterNotAllowedException("Cannot perform list_reduce on an empty input list");
				}
				left_vector.set_index(reduced_row_idx, info.list_entries[list_column_format_index].offset);
				reduced_row_idx++;
			} else {
				// Set the row as invalid and remove it from the active rows.
				FlatVector::SetNull(info.result, original_row_idx, true);
				active_rows.SetInvalid(original_row_idx);
			}
		}
		left_slice->Slice(left_vector, reduced_row_idx);

		if (info.has_index) {
			input_types.push_back(LogicalType::BIGINT);
		}
		input_types.push_back(left_slice->GetType());
		input_types.push_back(left_slice->GetType());
		// skip the first entry if there is an initial value
		for (idx_t i = info.has_initial ? 1 : 0; i < info.column_infos.size(); i++) {
			input_types.push_back(info.column_infos[i].vector.get().GetType());
		}

		expr_executor = make_uniq<ExpressionExecutor>(context, *info.lambda_expr);
	}